

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::run(cubeb_async_logger *this)

{
  anon_class_8_1_8991fb9c_for__M_head_impl local_20;
  thread local_18;
  
  local_20.this = this;
  std::thread::thread<cubeb_async_logger::run()::_lambda()_1_,,void>(&local_18,&local_20);
  std::thread::operator=(&this->logging_thread,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void run()
  {
    assert(logging_thread.get_id() == std::thread::id());
    logging_thread = std::thread([this]() {
      CUBEB_REGISTER_THREAD("cubeb_log");
      while (!shutdown_thread) {
        cubeb_log_message msg;
        while (msg_queue_consumer.load()->dequeue(&msg, 1)) {
          cubeb_log_internal_no_format(msg.get());
        }
        std::this_thread::sleep_for(
            std::chrono::milliseconds(CUBEB_LOG_BATCH_PRINT_INTERVAL_MS));
      }
      CUBEB_UNREGISTER_THREAD();
    });
  }